

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O3

void __thiscall
ON_3dmRenderSettingsPrivate::ON_3dmRenderSettingsPrivate(ON_3dmRenderSettingsPrivate *this)

{
  uint version;
  ON_RdkDocumentDefaults dd;
  ON_RdkDocumentDefaults OStack_118;
  
  this->_vptr_ON_3dmRenderSettingsPrivate = (_func_int **)&PTR__ON_3dmRenderSettingsPrivate_00808e28
  ;
  ON_XMLRootNode::ON_XMLRootNode(&this->_rdk_document_data);
  *(undefined8 *)((long)&this->_environments + 3) = 0;
  *(undefined8 *)((long)&this->_post_effects + 3) = 0;
  this->_sun = (ON_Sun *)0x0;
  this->_environments = (ON_EnvironmentsImpl *)0x0;
  this->_linear_workflow = (ON_LinearWorkflow *)0x0;
  this->_render_channels = (ON_RenderChannels *)0x0;
  this->_safe_frame = (ON_SafeFrame *)0x0;
  this->_skylight = (ON_Skylight *)0x0;
  this->_ground_plane = (ON_GroundPlane *)0x0;
  this->_dithering = (ON_Dithering *)0x0;
  CreateDocumentObjects(this);
  version = ON::VersionMajor();
  ON_RdkDocumentDefaults::ON_RdkDocumentDefaults(&OStack_118,version,All,(void *)0x0);
  ON_RdkDocumentDefaults::CopyDefaultsTo(&OStack_118,&(this->_rdk_document_data).super_ON_XMLNode);
  ON_RdkDocumentDefaults::~ON_RdkDocumentDefaults(&OStack_118);
  return;
}

Assistant:

ON_3dmRenderSettingsPrivate::ON_3dmRenderSettingsPrivate()
{
  CreateDocumentObjects();

  // 26th January 2023 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-71396
  // Populate the RDK document data with defaults. The previous fix for this did it in RdkDocNode()
  // which was the wrong place. We have to do it even if the RDK isn't being used.
  ON_RdkDocumentDefaults dd(ON::VersionMajor(), ON_RdkDocumentDefaults::ValueSets::All);
  dd.CopyDefaultsTo(_rdk_document_data);
}